

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_lib.cc
# Opt level: O1

void anon_unknown.dwarf_73c8::BandInit(int configuration,_func_int_int_int *Indexing,char *pattern)

{
  char cVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 *puVar10;
  int i;
  long lVar11;
  int j;
  long lVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int pick [3];
  int local_74 [5];
  undefined1 local_60 [16];
  long local_48;
  long local_40;
  long local_38;
  
  local_74[3] = 0;
  local_74[4] = 0;
  auVar14 = vpinsrd_avx(ZEXT416((uint)configuration),configuration / 6,1);
  auVar14 = vpinsrd_avx(auVar14,configuration / 0x24,2);
  auVar2 = vpinsrd_avx(auVar14,configuration / 0xd8,3);
  auVar16._8_4_ = 0x2aaaaaab;
  auVar16._0_8_ = 0x2aaaaaab2aaaaaab;
  auVar16._12_4_ = 0x2aaaaaab;
  auVar15 = vpmuldq_avx(auVar14,auVar16);
  auVar14 = vpshufd_avx(auVar2,0xf5);
  auVar16 = vpmuldq_avx(auVar14,auVar16);
  auVar14 = vpmovsxbd_avx(ZEXT416(0x7030501));
  auVar14 = vpermi2d_avx512vl(auVar14,auVar15,auVar16);
  auVar15 = vpsrld_avx(auVar14,0x1f);
  auVar14 = vpaddd_avx(auVar14,auVar15);
  auVar15._8_4_ = 6;
  auVar15._0_8_ = 0x600000006;
  auVar15._12_4_ = 6;
  auVar14 = vpmulld_avx512vl(auVar14,auVar15);
  local_60 = vpsubd_avx(auVar2,auVar14);
  local_74[0] = (configuration / 0x510) % 3;
  local_74[1] = (configuration / 0xf30) % 3;
  local_74[2] = configuration / 0x2d90;
  lVar11 = 0;
  do {
    iVar9 = (int)lVar11;
    if (configuration - 0x88b0U < 0x510) {
      iVar6 = (int)(lVar11 + 1);
      if (lVar11 + 1 == 3) {
        iVar6 = 0;
      }
      puVar10 = (anonymous_namespace)::permutations;
      lVar12 = 0;
      do {
        iVar4 = (*Indexing)(iVar6,(int)lVar12);
        cVar1 = pattern[iVar4];
        iVar4 = (*Indexing)(iVar9,*(int *)(puVar10 +
                                          (long)*(int *)(local_60 + lVar11 * 8 + -8) * 0xc) + 3);
        pattern[iVar4] = cVar1;
        iVar4 = (*Indexing)(iVar9 + 2 + ((iVar9 + 2U) / 3) * -3,(int)lVar12);
        cVar1 = pattern[iVar4];
        iVar4 = (*Indexing)(iVar9,*(int *)(puVar10 +
                                          (long)*(int *)(local_60 + lVar11 * 8 + -4) * 0xc) + 6);
        pattern[iVar4] = cVar1;
        lVar12 = lVar12 + 1;
        puVar10 = puVar10 + 4;
      } while (lVar12 != 3);
    }
    else {
      uVar5 = iVar9 + 2 + ((iVar9 + 2U) / 3) * -3;
      local_38 = (long)local_74[uVar5];
      iVar6 = (*Indexing)(uVar5,local_74[uVar5] % 3);
      cVar1 = pattern[iVar6];
      iVar6 = *(int *)(local_60 + lVar11 * 8 + -8);
      iVar4 = local_74[lVar11];
      local_40 = (long)(iVar4 % 3);
      iVar7 = (*Indexing)(iVar9,*(int *)((anonymous_namespace)::permutations +
                                        local_40 * 4 + (long)iVar6 * 0xc) + 3);
      pattern[iVar7] = cVar1;
      uVar13 = lVar11 + 1U & 0xffffffff;
      if (lVar11 + 1U == 3) {
        uVar13 = 0;
      }
      iVar7 = local_74[uVar13];
      iVar3 = (int)uVar13;
      iVar8 = (*Indexing)(iVar3,iVar7 + 1 + ((iVar7 + 1) / 3) * -3);
      cVar1 = pattern[iVar8];
      local_48 = (long)(iVar4 + 1 + ((iVar4 + 1) / 3) * -3);
      iVar8 = (*Indexing)(iVar9,*(int *)((anonymous_namespace)::permutations +
                                        local_48 * 4 + (long)iVar6 * 0xc) + 3);
      pattern[iVar8] = cVar1;
      iVar8 = (*Indexing)(iVar3,iVar7 + 2 + ((iVar7 + 2) / 3) * -3);
      cVar1 = pattern[iVar8];
      lVar12 = (long)(iVar4 + 2 + ((iVar4 + 2) / 3) * -3);
      iVar6 = (*Indexing)(iVar9,*(int *)((anonymous_namespace)::permutations +
                                        lVar12 * 4 + (long)iVar6 * 0xc) + 3);
      pattern[iVar6] = cVar1;
      iVar6 = (*Indexing)(iVar3,iVar7 % 3);
      cVar1 = pattern[iVar6];
      iVar6 = *(int *)(local_60 + lVar11 * 8 + -4);
      iVar4 = (*Indexing)(iVar9,*(int *)((anonymous_namespace)::permutations +
                                        local_40 * 4 + (long)iVar6 * 0xc) + 6);
      pattern[iVar4] = cVar1;
      iVar4 = (int)local_38;
      iVar7 = (*Indexing)(uVar5,iVar4 + 1 + ((iVar4 + 1) / 3) * -3);
      cVar1 = pattern[iVar7];
      iVar7 = (*Indexing)(iVar9,*(int *)((anonymous_namespace)::permutations +
                                        local_48 * 4 + (long)iVar6 * 0xc) + 6);
      pattern[iVar7] = cVar1;
      iVar4 = (*Indexing)(uVar5,iVar4 + 2 + ((iVar4 + 2) / 3) * -3);
      cVar1 = pattern[iVar4];
      iVar9 = (*Indexing)(iVar9,*(int *)((anonymous_namespace)::permutations +
                                        lVar12 * 4 + (long)iVar6 * 0xc) + 6);
      pattern[iVar9] = cVar1;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  return;
}

Assistant:

void BandInit(int configuration, int (*Indexing)(int, int), char *pattern) {
    int p[3][2] { { 0, 0 },
                  { configuration % 6, (configuration / 6) % 6 },
                  { (configuration / 36) % 6, (configuration / 216) % 6}};
    int picks = configuration / 1296;
    int pick[] { picks % 3, (picks / 3) % 3, picks / 9 };
    for (int i = 0; i < 3; i++) {
        if (picks == 27) {
            for (int j = 0; j < 3; j++) {
                pattern[Indexing(i, permutations[p[i][0]][j] + 3)] = pattern[Indexing((i + 1) % 3, j)];
                pattern[Indexing(i, permutations[p[i][1]][j] + 6)] = pattern[Indexing((i + 2) % 3, j)];
            }
        } else {
            pattern[Indexing(i, permutations[p[i][0]][((pick[i] + 0) % 3)] + 3)] = pattern[Indexing((i + 2) % 3, (pick[(i + 2) % 3] + 0) % 3)];
            pattern[Indexing(i, permutations[p[i][0]][((pick[i] + 1) % 3)] + 3)] = pattern[Indexing((i + 1) % 3, (pick[(i + 1) % 3] + 1) % 3)];
            pattern[Indexing(i, permutations[p[i][0]][((pick[i] + 2) % 3)] + 3)] = pattern[Indexing((i + 1) % 3, (pick[(i + 1) % 3] + 2) % 3)];

            pattern[Indexing(i, permutations[p[i][1]][((pick[i] + 0) % 3)] + 6)] = pattern[Indexing((i + 1) % 3, (pick[(i + 1) % 3] + 0) % 3)];
            pattern[Indexing(i, permutations[p[i][1]][((pick[i] + 1) % 3)] + 6)] = pattern[Indexing((i + 2) % 3, (pick[(i + 2) % 3] + 1) % 3)];
            pattern[Indexing(i, permutations[p[i][1]][((pick[i] + 2) % 3)] + 6)] = pattern[Indexing((i + 2) % 3, (pick[(i + 2) % 3] + 2) % 3)];
        }
    }
}